

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

void sysbvm_identityDictionary_increaseCapacity(sysbvm_context_t *context,sysbvm_tuple_t dictionary)

{
  ulong uVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  intptr_t iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = *(ulong *)(dictionary + 0x18);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    uVar6 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    uVar6 = 0;
  }
  uVar5 = (ulong)(uint)((int)uVar6 * 2);
  sVar3 = 8;
  if (8 < uVar5) {
    sVar3 = uVar5;
  }
  sVar3 = sysbvm_array_create(context,sVar3);
  *(sysbvm_tuple_t *)(dictionary + 0x18) = sVar3;
  if (uVar6 != 0) {
    uVar5 = 0;
    do {
      uVar2 = *(ulong *)(uVar1 + 0x10 + uVar5 * 8);
      if (uVar2 != 0) {
        if (((uVar2 & 0xf) == 0) && (7 < *(uint *)(uVar2 + 0xc))) {
          sVar3 = *(sysbvm_tuple_t *)(uVar2 + 0x10);
        }
        else {
          sVar3 = 0;
        }
        iVar4 = sysbvm_identityDictionary_scanFor(dictionary,sVar3);
        if (iVar4 < 0) {
          sysbvm_error_assertionFailure
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/dictionary.c:512: assertion failure: elementIndex >= 0"
                    );
        }
        *(ulong *)(*(long *)(dictionary + 0x18) + 0x10 + iVar4 * 8) = uVar2;
      }
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  return;
}

Assistant:

static void sysbvm_identityDictionary_increaseCapacity(sysbvm_context_t *context, sysbvm_tuple_t dictionary)
{
    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *oldStorage = (sysbvm_array_t*)dictionaryObject->storage;

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage);
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    sysbvm_array_t *newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity);
    dictionaryObject->storage = (sysbvm_tuple_t)newStorage;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        sysbvm_tuple_t association = oldStorage->elements[i];
        if(association)
            sysbvm_identityDictionary_insertNoCheck(dictionary, association);
    }
}